

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_set_num_stop_bits(cio_uart *port,cio_uart_num_stop_bits num_stop_bits)

{
  undefined1 local_58 [4];
  cio_error err;
  termios tty;
  cio_uart_num_stop_bits num_stop_bits_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty.c_ispeed = num_stop_bits;
    unique0x100000ad = port;
    port_local._4_4_ = get_current_settings(port,(termios *)local_58);
    if (port_local._4_4_ == CIO_SUCCESS) {
      if (tty.c_ispeed == 0) {
        tty.c_iflag = tty.c_iflag & 0xffffffbf;
      }
      else {
        if (tty.c_ispeed != 1) {
          return CIO_INVALID_ARGUMENT;
        }
        tty.c_iflag = tty.c_iflag | 0x40;
      }
      port_local._4_4_ = set_termios((stack0xffffffffffffffe8->impl).ev.fd,(termios *)local_58);
      if (port_local._4_4_ == CIO_SUCCESS) {
        port_local._4_4_ = CIO_SUCCESS;
      }
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_set_num_stop_bits(const struct cio_uart *port, enum cio_uart_num_stop_bits num_stop_bits)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (num_stop_bits) {
	case CIO_UART_ONE_STOP_BIT:
		tty.c_cflag &= ~(tcflag_t)CSTOPB;
		break;

	case CIO_UART_TWO_STOP_BITS:
		tty.c_cflag |= (tcflag_t)CSTOPB;
		break;

	default:
		return CIO_INVALID_ARGUMENT;
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}